

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  long lVar1;
  int *piVar2;
  size_t sVar3;
  ImageU8 *pIVar4;
  byte bVar5;
  int iVar6;
  void *pvVar7;
  IOException *pIVar8;
  long *plVar9;
  ulong uVar10;
  size_type *psVar11;
  size_t __n;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  void *pvVar20;
  pos_type pVar21;
  int depth;
  long height;
  long width;
  long maxval;
  float scale;
  ifstream in;
  undefined1 auStack_378 [7];
  allocator local_371;
  long local_370;
  ulong local_368;
  void *local_360;
  long local_358;
  size_t local_350;
  ulong local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  ImageU8 *local_318;
  uint local_30c;
  void *local_308;
  long local_300;
  __mbstate_t local_2f8;
  long local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  long local_2c8;
  long local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  void *local_278;
  void *local_270;
  long local_268;
  long local_260;
  long local_258;
  ulong local_250;
  long local_248;
  float local_23c;
  string local_238;
  byte *local_218;
  byte *local_210;
  
  local_338 = x;
  local_330 = y;
  local_318 = image;
  iVar6 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar6 == '\0') {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2e8,name,&local_371);
    std::operator+(&local_2b8,"Can only load PNM image (",&local_2e8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_238._M_dataplus._M_p = (pointer)*plVar9;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar9[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    gutil::IOException::IOException(pIVar8,&local_238);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar21 = anon_unknown_11::readPNMHeader
                     (name,(int *)&local_30c,&local_248,&local_23c,&local_2c0,&local_2c8);
  pIVar4 = local_318;
  local_2f8 = pVar21._M_state;
  if ((local_23c != 0.0) || (NAN(local_23c))) {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2e8,name,&local_371);
    std::operator+(&local_2b8,"A float image cannot be loaded as 8 bit image (",&local_2e8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_238._M_dataplus._M_p = (pointer)*plVar9;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar9[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    gutil::IOException::IOException(pIVar8,&local_238);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (0xff < local_248) {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2e8,name,&local_371);
    std::operator+(&local_2b8,"A 16 bit image cannot be loaded as 8 bit image (",&local_2e8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_238._M_dataplus._M_p = (pointer)*plVar9;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar9[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    gutil::IOException::IOException(pIVar8,&local_238);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  uVar19 = 1;
  if (1 < ds) {
    uVar19 = ds;
  }
  local_370 = w;
  if (w < 0) {
    local_370 = (long)(local_2c0 + (ulong)uVar19 + -1) / (long)(ulong)uVar19;
  }
  local_340 = CONCAT44(local_340._4_4_,ds);
  if (h < 0) {
    h = (long)(local_2c8 + (ulong)uVar19 + -1) / (long)(ulong)uVar19;
  }
  lVar14 = (long)(int)local_30c;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(local_318,local_370,h,lVar14);
  sVar3 = pIVar4->n;
  __n = -sVar3;
  if (0 < (long)sVar3) {
    __n = sVar3;
  }
  memset(pIVar4->pixel,0,__n);
  std::ifstream::ifstream(&local_238);
  lVar17 = *(long *)(local_238._M_dataplus._M_p + -0x18);
  *(undefined4 *)((long)&local_238.field_2 + lVar17 + 0xc) = 7;
  local_368 = pVar21._M_off;
  std::ios::clear((int)auStack_378 + (int)lVar17 + 0x140);
  iVar6 = (int)local_340;
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)name);
  local_328 = local_2c8;
  local_300 = h;
  if ((((iVar6 < 2) && (local_330 == 0 && local_338 == 0)) && (local_370 == local_2c0)) &&
     (h == local_2c8)) {
    std::istream::seekg(&local_238,local_368,local_2f8);
    if (0 < h) {
      lVar14 = 0;
      do {
        if (0 < local_370) {
          lVar17 = 0;
          do {
            if (0 < (int)local_30c) {
              uVar15 = 0;
              do {
                if (local_218 < local_210) {
                  bVar5 = *local_218;
                  local_218 = local_218 + 1;
                }
                else {
                  bVar5 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                    (&local_238.field_2);
                }
                local_318->img[uVar15][lVar14][lVar17] = bVar5;
                uVar15 = uVar15 + 1;
              } while (local_30c != uVar15);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != local_370);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_300);
    }
  }
  else {
    local_348 = CONCAT44(local_348._4_4_,uVar19);
    local_358 = local_2c0;
    lVar17 = local_370 * lVar14;
    local_350 = lVar17 * 4;
    pvVar7 = operator_new(local_350);
    sVar3 = local_350;
    if (lVar17 != 0) {
      memset(pvVar7,0,local_350);
    }
    local_360 = operator_new(sVar3);
    if (lVar17 != 0) {
      memset(local_360,0,local_350);
    }
    lVar13 = 0;
    if (-local_330 != 0 && local_330 < 1) {
      lVar13 = -local_330;
    }
    if (lVar13 < h) {
      uVar15 = local_348 & 0xffffffff;
      local_260 = local_358 * lVar14;
      lVar12 = 0;
      if (0 < local_338) {
        lVar12 = local_338;
      }
      local_320 = -local_338;
      if (-local_338 == 0 || 0 < local_338) {
        local_320 = 0;
      }
      local_298 = local_320 * lVar14;
      local_348 = (ulong)(int)local_340;
      local_270 = (void *)((long)local_360 + local_298 * 4);
      local_2f0 = lVar14 * 4;
      local_278 = (void *)((long)pvVar7 + local_298 * 4);
      local_268 = lVar12 * uVar15 * lVar14 + local_368;
      lVar12 = local_358;
      local_368 = uVar15;
      local_308 = pvVar7;
      local_290 = lVar17;
      local_288 = lVar14;
      do {
        sVar3 = local_350;
        local_258 = (lVar13 + local_330) * uVar15;
        pvVar7 = local_308;
        if (local_328 <= local_258) break;
        local_280 = lVar13;
        if (local_290 != 0) {
          memset(local_308,0,local_350);
          memset(local_360,0,sVar3);
          lVar12 = local_358;
          uVar15 = local_368;
        }
        uVar10 = 0;
        do {
          if (local_328 <= (long)(uVar10 + local_258)) break;
          local_250 = uVar10;
          std::istream::seekg(&local_238,(uVar10 + local_258) * local_260 + local_268,local_2f8);
          lVar12 = local_358;
          uVar10 = local_348;
          uVar15 = local_368;
          lVar14 = local_2f0;
          lVar17 = local_320;
          pvVar7 = local_278;
          pvVar20 = local_270;
          if (local_320 < local_370) {
            do {
              lVar13 = (lVar17 + local_338) * uVar15;
              if (lVar12 <= lVar13) break;
              lVar16 = 0;
              do {
                if (0 < (int)local_30c) {
                  uVar18 = 0;
                  do {
                    if (local_218 < local_210) {
                      bVar5 = *local_218;
                      local_218 = local_218 + 1;
                    }
                    else {
                      local_340 = lVar17;
                      bVar5 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                        (&local_238.field_2);
                      lVar12 = local_358;
                      uVar10 = local_348;
                      uVar15 = local_368;
                      lVar14 = local_2f0;
                      lVar17 = local_340;
                    }
                    piVar2 = (int *)((long)pvVar7 + uVar18 * 4);
                    *piVar2 = *piVar2 + (uint)bVar5;
                    piVar2 = (int *)((long)pvVar20 + uVar18 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar18 = uVar18 + 1;
                  } while (local_30c != uVar18);
                }
              } while ((lVar16 + 1 < (long)uVar10) &&
                      (lVar1 = lVar13 + lVar16, lVar16 = lVar16 + 1, lVar1 + 1 < lVar12));
              lVar17 = lVar17 + 1;
              pvVar7 = (void *)((long)pvVar7 + lVar14);
              pvVar20 = (void *)((long)pvVar20 + lVar14);
            } while (lVar17 != local_370);
          }
          uVar10 = local_250 + 1;
        } while (uVar10 != uVar15);
        lVar14 = local_320;
        lVar17 = local_298;
        if (local_320 < local_370) {
          do {
            if (lVar12 <= (long)((local_338 + lVar14) * uVar15)) break;
            if (0 < (int)local_288) {
              uVar15 = 0;
              do {
                iVar6 = *(int *)((long)local_360 + uVar15 * 4 + lVar17 * 4);
                if (0 < iVar6) {
                  local_318->img[uVar15][local_280][lVar14] =
                       (uchar)(*(int *)((long)local_308 + uVar15 * 4 + lVar17 * 4) / iVar6);
                }
                uVar15 = uVar15 + 1;
              } while (local_30c != uVar15);
              lVar17 = lVar17 + uVar15;
              lVar12 = local_358;
              uVar15 = local_368;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != local_370);
        }
        lVar13 = local_280 + 1;
        pvVar7 = local_308;
      } while (lVar13 != local_300);
    }
    operator_delete(local_360);
    operator_delete(pvVar7);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_238);
  return;
}

Assistant:

void PNMImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w*depth);
      std::valarray<int> nline(0, w*depth);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth+
                   static_cast<std::streamoff>(std::max(0l, x))*ds*depth);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              for (int d=0; d<depth; d++)
              {
                ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

                if (image.isValidS(v))
                {
                  vline[j+d]+=v;
                  nline[j+d]++;
                }
              }
            }

            j+=depth;
          }
        }

        // store line into image

        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
    }
    else // load whole image
    {
      in.seekg(pos);
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(sb->sbumpc()));
          }
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}